

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::FormatFPositiveExpSlow
          (anon_unknown_0 *this,uint128 v,int exp,FormatState *state)

{
  uint128 v_00;
  undefined4 in_register_0000000c;
  anon_class_8_1_a8a4b3b1 local_50;
  FunctionRef<void_(absl::lts_20250127::str_format_internal::(anonymous_namespace)::BinaryToDecimal)>
  local_48;
  anon_unknown_0 *local_38;
  uint64_t local_30;
  FormatState *local_28;
  FormatState *state_local;
  anon_unknown_0 *paStack_18;
  int exp_local;
  uint128 v_local;
  
  local_50.state = (FormatState *)CONCAT44(in_register_0000000c,exp);
  local_30 = v.lo_;
  local_38 = this;
  local_28 = local_50.state;
  state_local._4_4_ = (int)v.hi_;
  paStack_18 = this;
  v_local.lo_ = local_30;
  FunctionRef<void(absl::lts_20250127::str_format_internal::(anonymous_namespace)::BinaryToDecimal)>
  ::
  FunctionRef<absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatFPositiveExpSlow(absl::lts_20250127::uint128,int,absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatState_const&)::__0,void>
            ((FunctionRef<void(absl::lts_20250127::str_format_internal::(anonymous_namespace)::BinaryToDecimal)>
              *)&local_48,&local_50);
  v_00.hi_ = local_30;
  v_00.lo_ = (uint64_t)local_38;
  BinaryToDecimal::RunConversion(v_00,(int)v.hi_,local_48);
  return;
}

Assistant:

void FormatFPositiveExpSlow(uint128 v, int exp, const FormatState &state) {
  BinaryToDecimal::RunConversion(v, exp, [&](BinaryToDecimal btd) {
    const size_t total_digits =
        btd.TotalDigits() + (state.ShouldPrintDot() ? state.precision + 1 : 0);

    const auto padding = ExtraWidthToPadding(
        total_digits + (state.sign_char != '\0' ? 1 : 0), state);

    state.sink->Append(padding.left_spaces, ' ');
    if (state.sign_char != '\0')
      state.sink->Append(1, state.sign_char);
    state.sink->Append(padding.zeros, '0');

    do {
      state.sink->Append(btd.CurrentDigits());
    } while (btd.AdvanceDigits());

    if (state.ShouldPrintDot())
      state.sink->Append(1, '.');
    state.sink->Append(state.precision, '0');
    state.sink->Append(padding.right_spaces, ' ');
  });
}